

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::a64::Assembler::align(Assembler *this,AlignMode alignMode,uint32_t alignment)

{
  bool bVar1;
  Error EVar2;
  byte *pbVar3;
  uint in_EDX;
  byte in_SIL;
  BaseAssembler *in_RDI;
  StringTmp<128UL> sb;
  uint32_t pattern;
  Error _err;
  CodeWriter writer;
  uint32_t i;
  uint32_t kNopA64;
  char *in_stack_00000210;
  int in_stack_0000021c;
  char *in_stack_00000220;
  StringTmp<128UL> *in_stack_fffffffffffffe18;
  CodeWriter *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  BaseAssembler *in_stack_fffffffffffffe30;
  String *in_stack_fffffffffffffe38;
  BaseAssembler *in_stack_fffffffffffffe40;
  StringTmp<128UL> *this_00;
  CodeWriter *in_stack_fffffffffffffe48;
  StringTmp<128UL> local_198;
  undefined1 auStack_197 [7];
  ulong local_190;
  undefined1 *local_180;
  CodeWriter local_e8;
  uint local_e0;
  undefined4 local_dc;
  uint local_d8;
  byte local_d1;
  Error local_c4;
  long local_a8;
  StringTmp<128UL> *local_a0;
  ulong local_98;
  undefined1 local_89;
  StringTmp<128UL> *local_88;
  undefined4 local_7c;
  Logger *local_78;
  uint *local_70;
  char *local_68;
  String *local_60;
  StringTmp<128UL> *local_58;
  Logger *local_50;
  long local_40;
  undefined4 local_34;
  FormatOptions *local_30;
  StringTmp<128UL> *local_28;
  StringTmp<128UL> *local_20;
  StringTmp<128UL> *local_18;
  StringTmp<128UL> *local_10;
  StringTmp<128UL> *local_8;
  
  local_dc = 0xd503201f;
  if ((in_RDI->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    DebugUtils::errored(5);
    local_c4 = BaseEmitter::reportError
                         (&in_stack_fffffffffffffe30->super_BaseEmitter,
                          (Error)(in_stack_fffffffffffffe28 >> 0x20),
                          (char *)in_stack_fffffffffffffe20);
  }
  else if (in_SIL < 3) {
    if (in_EDX < 2) {
      local_c4 = 0;
    }
    else {
      bVar1 = true;
      if (in_EDX < 0x41) {
        bVar1 = in_EDX == 0 || (in_EDX & in_EDX - 1) != 0;
      }
      if (bVar1) {
        DebugUtils::errored(2);
        local_c4 = BaseEmitter::reportError
                             (&in_stack_fffffffffffffe30->super_BaseEmitter,
                              (Error)(in_stack_fffffffffffffe28 >> 0x20),
                              (char *)in_stack_fffffffffffffe20);
      }
      else {
        local_a8 = (long)in_RDI->_bufferPtr - (long)in_RDI->_bufferData;
        local_e0 = ((int)local_a8 + (in_EDX - 1) & (in_EDX - 1 ^ 0xffffffff)) - (int)local_a8;
        if (local_e0 == 0) {
          local_c4 = 0;
        }
        else {
          local_d8 = in_EDX;
          local_d1 = in_SIL;
          local_40 = local_a8;
          CodeWriter::CodeWriter(&local_e8,in_RDI);
          local_c4 = CodeWriter::ensureSpace
                               (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                (size_t)in_stack_fffffffffffffe38);
          if (local_c4 == 0) {
            if (local_d1 == 0) {
              if (((long)in_RDI->_bufferPtr - (long)in_RDI->_bufferData & 3U) != 0) {
                EVar2 = DebugUtils::errored(3);
                return EVar2;
              }
              for (; 3 < local_e0; local_e0 = local_e0 - 4) {
                CodeWriter::emit32uLE<unsigned_int>(&local_e8,0xd503201f);
              }
              if (local_e0 != 0) {
                DebugUtils::assertionFailed(in_stack_00000220,in_stack_0000021c,in_stack_00000210);
              }
            }
            else if ((byte)(local_d1 - 1) < 2) {
              CodeWriter::emitZeros(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
            }
            CodeWriter::done((CodeWriter *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
            if ((in_RDI->super_BaseEmitter)._logger != (Logger *)0x0) {
              this_00 = &local_198;
              local_a0 = this_00;
              local_8 = this_00;
              memset(this_00,0,0x20);
              StringTmp<128UL>::_resetToTemporary(this_00);
              local_78 = (in_RDI->super_BaseEmitter)._logger;
              local_7c = 0;
              local_30 = &local_78->_options;
              local_34 = 0;
              pbVar3 = Support::Array<unsigned_char,_4UL>::
                       operator[]<asmjit::v1_14::FormatIndentationGroup>
                                 ((Array<unsigned_char,_4UL> *)in_stack_fffffffffffffe20,
                                  (FormatIndentationGroup *)in_stack_fffffffffffffe18);
              local_98 = (ulong)*pbVar3;
              local_88 = &local_198;
              local_89 = 0x20;
              String::_opChars(in_stack_fffffffffffffe38,
                               (ModifyOp)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                               (char)((ulong)in_stack_fffffffffffffe30 >> 0x18),
                               in_stack_fffffffffffffe28);
              local_60 = (String *)&local_198;
              local_68 = "align %u\n";
              local_70 = &local_d8;
              String::_opFormat(local_60,kAppend,"align %u\n",(ulong)local_d8);
              local_50 = (in_RDI->super_BaseEmitter)._logger;
              local_58 = &local_198;
              if ((byte)local_198 < 0x1f) {
                local_180 = auStack_197;
                local_190 = (ulong)(byte)local_198;
              }
              local_28 = local_58;
              local_20 = local_58;
              local_18 = local_58;
              local_10 = local_58;
              (*local_50->_vptr_Logger[2])(local_50,local_180,local_190);
              StringTmp<128UL>::~StringTmp(in_stack_fffffffffffffe18);
            }
            local_c4 = 0;
          }
        }
      }
    }
  }
  else {
    DebugUtils::errored(2);
    local_c4 = BaseEmitter::reportError
                         (&in_stack_fffffffffffffe30->super_BaseEmitter,
                          (Error)(in_stack_fffffffffffffe28 >> 0x20),
                          (char *)in_stack_fffffffffffffe20);
  }
  return local_c4;
}

Assistant:

Error Assembler::align(AlignMode alignMode, uint32_t alignment) {
  constexpr uint32_t kNopA64 = 0xD503201Fu; // [11010101|00000011|00100000|00011111].

  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(uint32_t(alignMode) > uint32_t(AlignMode::kMaxValue)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (ASMJIT_UNLIKELY(alignment > Globals::kMaxAlignment || !Support::isPowerOf2(alignment)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = uint32_t(Support::alignUpDiff<size_t>(offset(), alignment));
  if (i == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, i));

  switch (alignMode) {
    case AlignMode::kCode: {
      uint32_t pattern = kNopA64;

      if (ASMJIT_UNLIKELY(offset() & 0x3u))
        return DebugUtils::errored(kErrorInvalidState);

      while (i >= 4) {
        writer.emit32uLE(pattern);
        i -= 4;
      }

      ASMJIT_ASSERT(i == 0);
      break;
    }

    case AlignMode::kData:
    case AlignMode::kZero:
      writer.emitZeros(i);
      break;
  }

  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<128> sb;
    sb.appendChars(' ', _logger->indentation(FormatIndentationGroup::kCode));
    sb.appendFormat("align %u\n", alignment);
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}